

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

void vli_modAdd(uECC_word_t *result,uECC_word_t *left,uECC_word_t *right,uECC_word_t *mod)

{
  cmpresult_t cVar1;
  uECC_word_t uVar2;
  uECC_word_t carry;
  uECC_word_t *mod_local;
  uECC_word_t *right_local;
  uECC_word_t *left_local;
  uECC_word_t *result_local;
  
  uVar2 = vli_add(result,left,right);
  if ((uVar2 == 0) && (cVar1 = vli_cmp(result,mod), cVar1 < 0)) {
    return;
  }
  vli_sub(result,result,mod);
  return;
}

Assistant:

static void vli_modAdd(uECC_word_t *result,
                       const uECC_word_t *left,
                       const uECC_word_t *right,
                       const uECC_word_t *mod) {
    uECC_word_t carry = vli_add(result, left, right);
    if (carry || vli_cmp(result, mod) >= 0) {
        /* result > mod (result = mod + remainder), so subtract mod to get remainder. */
        vli_sub(result, result, mod);
    }
}